

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

bool tchecker::ta::has_diagonal_constraint(system_t *system)

{
  bool bVar1;
  has_clock_constraints_t hVar2;
  loc_id_t id;
  edge_id_t id_00;
  const_iterator_t *pcVar3;
  element_type *this;
  edges_collection_const_iterator_t *peVar4;
  element_type *this_00;
  typed_expression_t *ptVar5;
  undefined1 local_b0 [6];
  has_clock_constraints_t guard_has_clock_constrains;
  edge_const_shared_ptr_t *edge;
  edges_collection_const_iterator_t __end2_1;
  edges_collection_const_iterator_t __begin2_1;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *__range2_1;
  undefined1 local_58 [6];
  has_clock_constraints_t invariant_has_clock_constraints;
  loc_const_shared_ptr_t *loc;
  const_iterator_t __end2;
  const_iterator_t __begin2;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  *__range2;
  system_t *system_local;
  
  ___begin2 = tchecker::system::locs_t::locations
                        (&(system->super_system_t).super_system_t.super_locs_t);
  pcVar3 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::begin((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                    *)&__begin2);
  __end2.super_const_iterator._M_current = (const_iterator)(pcVar3->super_const_iterator)._M_current
  ;
  pcVar3 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::end((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                  *)&__begin2);
  loc = (loc_const_shared_ptr_t *)(pcVar3->super_const_iterator)._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2.super_const_iterator,
                            (__normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
                             *)&loc), bVar1) {
    tchecker::system::locs_t::const_iterator_t::operator*((const_iterator_t *)local_58);
    this = std::
           __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_58);
    id = tchecker::system::loc_t::id(this);
    ptVar5 = system_t::invariant(system,id);
    hVar2 = has_clock_constraints(ptVar5);
    bVar1 = ((ushort)hVar2 & 0x100) != 0;
    if (bVar1) {
      system_local._7_1_ = 1;
    }
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)local_58);
    if (bVar1) goto LAB_0030da52;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
    ::operator++(&__end2.super_const_iterator);
  }
  ___begin2_1 = tchecker::system::edges_t::edges
                          (&(system->super_system_t).super_system_t.super_edges_t);
  peVar4 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                    *)&__begin2_1);
  __end2_1.super_const_iterator._M_current =
       (const_iterator)(peVar4->super_const_iterator)._M_current;
  peVar4 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::end((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                  *)&__begin2_1);
  edge = (edge_const_shared_ptr_t *)(peVar4->super_const_iterator)._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1.super_const_iterator,
                            (__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                             *)&edge), bVar1) {
    tchecker::system::edges_collection_const_iterator_t::operator*
              ((edges_collection_const_iterator_t *)local_b0);
    this_00 = std::
              __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_b0);
    id_00 = tchecker::system::edge_t::id(this_00);
    ptVar5 = system_t::guard(system,id_00);
    hVar2 = has_clock_constraints(ptVar5);
    bVar1 = ((ushort)hVar2 & 0x100) != 0;
    if (bVar1) {
      system_local._7_1_ = 1;
    }
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)local_b0);
    if (bVar1) goto LAB_0030da52;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(&__end2_1.super_const_iterator);
  }
  system_local._7_1_ = 0;
LAB_0030da52:
  return (bool)(system_local._7_1_ & 1);
}

Assistant:

bool has_diagonal_constraint(tchecker::ta::system_t const & system)
{
  // Check location invariants
  for (tchecker::system::loc_const_shared_ptr_t const & loc : system.locations()) {
    tchecker::has_clock_constraints_t invariant_has_clock_constraints =
        tchecker::has_clock_constraints(system.invariant(loc->id()));
    if (invariant_has_clock_constraints.diagonal)
      return true;
  }

  // Check edge guards
  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    tchecker::has_clock_constraints_t guard_has_clock_constrains = tchecker::has_clock_constraints(system.guard(edge->id()));
    if (guard_has_clock_constrains.diagonal)
      return true;
  }

  return false;
}